

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  uchar *puVar5;
  int *piVar6;
  int line;
  uint uVar7;
  int iVar8;
  int *piVar9;
  size_t sVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  char *pcVar16;
  size_t sVar17;
  uchar *puVar18;
  uint uVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar23;
  undefined4 uVar25;
  ulong uVar24;
  uint local_48;
  
  uVar13 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar13) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xc06,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar3 = ssl->in_msg;
  uVar13 = ((ulong)pbVar3[3] | (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10)) + uVar13;
  ssl->in_hslen = uVar13;
  uVar23 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar3);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc11,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar23,
             uVar13);
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xc4f,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
    return 0;
  }
  pmVar4 = ssl->handshake;
  puVar5 = ssl->in_msg;
  if (pmVar4 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar12 = *(ushort *)(puVar5 + 4) << 8 | *(ushort *)(puVar5 + 4) >> 8;
    if ((uint)uVar12 != pmVar4->in_msg_seq) {
      uVar25 = (undefined4)((ulong)uVar23 >> 0x20);
      if (((uint)uVar12 != pmVar4->in_flight_start_seq - 1) || (*puVar5 == '\x03')) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xc33,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                   (ulong)uVar12,CONCAT44(uVar25,pmVar4->in_msg_seq),uVar13);
        return -0x6900;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xc26,"received message from last flight, message_seq = %d, start_of_flight = %d",
                 (ulong)uVar12,CONCAT44(uVar25,pmVar4->in_flight_start_seq),uVar13);
      iVar8 = mbedtls_ssl_resend(ssl);
      if (iVar8 == 0) {
        return -0x6900;
      }
      pcVar16 = "mbedtls_ssl_resend";
      line = 0xc2a;
      goto LAB_00113db0;
    }
  }
  if (((ssl->in_hslen <= ssl->in_msglen) && (puVar5[8] == '\0' && *(short *)(puVar5 + 6) == 0)) &&
     (puVar5[0xb] == puVar5[3] && *(short *)(puVar5 + 9) == *(short *)(puVar5 + 1))) {
    if (pmVar4 == (mbedtls_ssl_handshake_params *)0x0) {
      return 0;
    }
    if (pmVar4->hs_msg == (uchar *)0x0) {
      return 0;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xc41,"found fragmented DTLS handshake message");
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pcVar16 = "not supported outside handshake (for now)";
    iVar8 = 0xb75;
LAB_00113c02:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar8,pcVar16);
    iVar8 = -0x7080;
  }
  else {
    sVar17 = ssl->in_hslen;
    uVar1 = sVar17 - 0xc;
    piVar6 = (int *)ssl->handshake->hs_msg;
    if (piVar6 == (int *)0x0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb81,"initialize reassembly, total length = %d",uVar1,uVar23,uVar13);
      if (0x4000 < ssl->in_hslen) {
        pcVar16 = "handshake message too large";
        iVar8 = 0xb85;
        goto LAB_00113c02;
      }
      sVar10 = ((uVar1 >> 3) + sVar17 + 1) - (ulong)((uVar1 & 7) == 0);
      puVar5 = (uchar *)calloc(1,sVar10);
      pmVar4 = ssl->handshake;
      pmVar4->hs_msg = puVar5;
      if (puVar5 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb8f,"alloc failed (%d bytes)",sVar10,uVar23,uVar13);
        iVar8 = -0x7f00;
        goto LAB_00113d95;
      }
      puVar18 = ssl->in_msg;
      *(undefined2 *)(puVar5 + 4) = *(undefined2 *)(puVar18 + 4);
      *(undefined4 *)puVar5 = *(undefined4 *)puVar18;
      puVar5 = pmVar4->hs_msg;
      puVar5[8] = '\0';
      puVar5[6] = '\0';
      puVar5[7] = '\0';
      puVar5 = ssl->handshake->hs_msg;
      puVar5[0xb] = puVar5[3];
      *(undefined2 *)(puVar5 + 9) = *(undefined2 *)(puVar5 + 1);
      piVar9 = (int *)ssl->in_msg;
      piVar6 = (int *)ssl->handshake->hs_msg;
LAB_00113cf2:
      bVar20 = *(byte *)(piVar9 + 2);
      uVar22 = (ulong)((uint)*(byte *)((long)piVar9 + 7) << 8 |
                      (uint)*(byte *)((long)piVar9 + 6) << 0x10) | (ulong)bVar20;
      uVar21 = (uint)*(byte *)((long)piVar9 + 10) << 8 | (uint)*(byte *)((long)piVar9 + 9) << 0x10;
      bVar14 = *(byte *)((long)piVar9 + 0xb);
      sVar10 = (ulong)bVar14 + (ulong)uVar21;
      if (uVar1 < sVar10 + uVar22) {
        pcVar16 = "invalid fragment offset/len: %d + %d > %d";
        iVar8 = 0xbb4;
        uVar24 = sVar10;
        uVar13 = uVar1;
      }
      else {
        uVar2 = sVar10 + 0xc;
        uVar24 = ssl->in_msglen;
        if (uVar2 <= uVar24) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0xbc0,"adding fragment, offset = %d, length = %d",uVar22,sVar10,uVar13);
          memcpy((void *)((long)piVar6 + uVar22 + 0xc),ssl->in_msg + 0xc,sVar10);
          bVar20 = bVar20 & 7;
          if (bVar20 == 0) {
LAB_00113ef4:
            if ((sVar10 & 7) != 0) {
              uVar13 = uVar22 + sVar10 >> 3;
              bVar20 = *(byte *)((long)piVar6 + uVar13 + sVar17);
              iVar8 = 8 - ((uint)sVar10 & 7);
              do {
                bVar20 = bVar20 | (byte)(1 << ((byte)iVar8 & 0x1f));
                iVar8 = iVar8 + 1;
              } while (iVar8 != 8);
              *(byte *)((long)piVar6 + uVar13 + sVar17) = bVar20;
            }
            memset((void *)((long)piVar6 + (uVar22 >> 3) + sVar17),0xff,sVar10 >> 3);
          }
          else {
            bVar20 = 8 - bVar20;
            uVar13 = uVar22 >> 3;
            uVar19 = (uint)sVar10;
            uVar7 = (uint)bVar20;
            if (uVar19 < bVar20 || uVar19 == uVar7) {
              if (sVar10 != 0) {
                bVar15 = *(byte *)((long)piVar6 + uVar13 + sVar17);
                local_48 = (uint)bVar14;
                iVar8 = uVar7 - (uVar21 + local_48);
                do {
                  bVar15 = bVar15 | (byte)(1 << ((byte)iVar8 & 0x1f));
                  iVar8 = iVar8 + 1;
                  sVar10 = sVar10 - 1;
                } while (sVar10 != 0);
                *(byte *)((long)piVar6 + uVar13 + sVar17) = bVar15;
                sVar10 = 0;
                goto LAB_00113eec;
              }
            }
            else {
              bVar14 = *(byte *)((long)piVar6 + uVar13 + sVar17);
              do {
                uVar7 = uVar7 - 1;
                bVar14 = bVar14 | (byte)(1 << ((byte)uVar7 & 0x1f));
              } while (uVar7 != 0);
              uVar22 = uVar22 + bVar20;
              sVar10 = sVar10 - bVar20;
              *(byte *)((long)piVar6 + uVar13 + sVar17) = bVar14;
LAB_00113eec:
              if (bVar20 < uVar19) goto LAB_00113ef4;
            }
          }
          if (7 < uVar1) {
            uVar13 = 0;
            do {
              if (*(char *)((long)piVar6 + uVar13 + sVar17) != -1) goto LAB_00113fce;
              uVar13 = uVar13 + 1;
            } while (uVar1 >> 3 != uVar13);
          }
          if ((uVar1 & 7) != 0) {
            lVar11 = 0;
            do {
              if ((*(byte *)((long)piVar6 + (uVar1 >> 3) + sVar17) >> ((int)lVar11 + 7U & 0x1f) & 1)
                  == 0) goto LAB_00113fce;
              lVar11 = lVar11 + -1;
            } while (-lVar11 != (uVar1 & 7));
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0xbcf,"handshake message completed");
          if (ssl->in_msglen <= uVar2) {
            uVar13 = ssl->next_record_offset;
            sVar10 = ssl->in_left - uVar13;
            if (ssl->in_left < uVar13 || sVar10 == 0) {
LAB_00114083:
              memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
              free(ssl->handshake->hs_msg);
              ssl->handshake->hs_msg = (uchar *)0x0;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0xbfb,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
              return 0;
            }
            puVar5 = ssl->in_hdr;
            sVar17 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar5;
            ssl->next_record_offset = sVar17;
            puVar18 = (uchar *)(sVar17 + sVar10);
            ssl->in_left = (size_t)puVar18;
            if (puVar18 <= ssl->in_buf + (0x414d - (long)puVar5)) {
              memmove(ssl->in_msg + ssl->in_hslen,puVar5 + uVar13,sVar10);
              goto LAB_00114083;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xbee,"reassembled message too large for buffer");
            iVar8 = -0x6a00;
            goto LAB_00113d95;
          }
          pcVar16 = "last fragment not alone in its record";
          iVar8 = 0xbd8;
          goto LAB_00113c02;
        }
        pcVar16 = "invalid fragment length: %d + 12 > %d";
        iVar8 = 0xbbb;
        uVar22 = sVar10;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,iVar8,pcVar16,uVar22,uVar24,uVar13);
    }
    else {
      piVar9 = (int *)ssl->in_msg;
      if (*piVar6 == *piVar9) goto LAB_00113cf2;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xb9f,"fragment header mismatch");
    }
    iVar8 = -0x7200;
  }
LAB_00113d95:
  pcVar16 = "ssl_reassemble_dtls_handshake";
  line = 0xc45;
LAB_00113db0:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,line,pcVar16,iVar8);
  return iVar8;
LAB_00113fce:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xbcb,"message is not complete yet");
  iVar8 = -0x6900;
  goto LAB_00113d95;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}